

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void rw::flipDXT3(uint8 *dst,uint8 *src,uint32 width,uint32 height)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint8 *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = width + 3;
  uVar4 = uVar1 >> 2;
  if (height < 4) {
    if (height != 2) {
      memcpy(dst,src,(ulong)(uVar4 << 4));
      return;
    }
    if (3 < uVar1) {
      lVar2 = 0;
      do {
        dst[lVar2] = src[lVar2 + 2];
        dst[lVar2 + 1] = src[lVar2 + 3];
        dst[lVar2 + 2] = src[lVar2];
        dst[lVar2 + 3] = src[lVar2 + 1];
        dst[lVar2 + 4] = src[lVar2 + 4];
        dst[lVar2 + 5] = src[lVar2 + 5];
        dst[lVar2 + 6] = src[lVar2 + 6];
        dst[lVar2 + 7] = src[lVar2 + 7];
        dst[lVar2 + 8] = src[lVar2 + 8];
        dst[lVar2 + 9] = src[lVar2 + 9];
        dst[lVar2 + 10] = src[lVar2 + 10];
        dst[lVar2 + 0xb] = src[lVar2 + 0xb];
        dst[lVar2 + 0xc] = src[lVar2 + 0xd];
        dst[lVar2 + 0xd] = src[lVar2 + 0xc];
        dst[lVar2 + 0xe] = src[lVar2 + 0xe];
        dst[lVar2 + 0xf] = src[lVar2 + 0xf];
        lVar2 = lVar2 + 0x10;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  else if (3 < height + 3) {
    uVar3 = height + 3 >> 2;
    uVar6 = (ulong)(uVar4 * 0x10);
    puVar5 = dst + (uVar4 * 0x10 * uVar3 - uVar6) + 0xf;
    uVar7 = 0;
    do {
      if (3 < uVar1) {
        lVar2 = 0;
        uVar8 = uVar4;
        do {
          puVar5[lVar2 + -9] = src[lVar2];
          puVar5[lVar2 + -8] = src[lVar2 + 1];
          puVar5[lVar2 + -0xb] = src[lVar2 + 2];
          puVar5[lVar2 + -10] = src[lVar2 + 3];
          puVar5[lVar2 + -0xd] = src[lVar2 + 4];
          puVar5[lVar2 + -0xc] = src[lVar2 + 5];
          puVar5[lVar2 + -0xf] = src[lVar2 + 6];
          puVar5[lVar2 + -0xe] = src[lVar2 + 7];
          puVar5[lVar2 + -7] = src[lVar2 + 8];
          puVar5[lVar2 + -6] = src[lVar2 + 9];
          puVar5[lVar2 + -5] = src[lVar2 + 10];
          puVar5[lVar2 + -4] = src[lVar2 + 0xb];
          puVar5[lVar2 + -3] = src[lVar2 + 0xf];
          puVar5[lVar2 + -2] = src[lVar2 + 0xe];
          puVar5[lVar2 + -1] = src[lVar2 + 0xd];
          puVar5[lVar2] = src[lVar2 + 0xc];
          lVar2 = lVar2 + 0x10;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      src = src + uVar6;
      uVar7 = uVar7 + 1;
      puVar5 = puVar5 + -uVar6;
    } while (uVar7 != uVar3);
  }
  return;
}

Assistant:

void
flipDXT3(uint8 *dst, uint8 *src, uint32 width, uint32 height)
{
	int x, y;
	int bw = (width+3)/4;
	int bh = (height+3)/4;
	if(height < 4){
		// used pixels are always at the top
		// so don't swap the full 4 rows
		if(height == 2){
			uint8 *s = src;
			uint8 *d = dst;
			for(x = 0; x < bw; x++){
				flipAlphaBlock3_half(d, s);
				flipBlock_half(d+8, s+8);
				s += 16;
				d += 16;
			}
		}else
			memcpy(dst, src, 16*bw);
		return;
	}
	dst += 16*bw*bh;
	for(y = 0; y < bh; y++){
		dst -= 16*bw;
		uint8 *s = src;
		uint8 *d = dst;
		for(x = 0; x < bw; x++){
			flipAlphaBlock3(d, s);
			flipBlock(d+8, s+8);
			s += 16;
			d += 16;
		}
		src += 16*bw;
	}
}